

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

uint8 get8(vorb *z)

{
  byte *pbVar1;
  uint uVar2;
  
  pbVar1 = z->stream;
  if (pbVar1 == (byte *)0x0) {
    uVar2 = fgetc((FILE *)z->f);
    if (uVar2 != 0xffffffff) goto LAB_0011a13a;
  }
  else if (pbVar1 < z->stream_end) {
    z->stream = pbVar1 + 1;
    uVar2 = (uint)*pbVar1;
    goto LAB_0011a13a;
  }
  z->eof = 1;
  uVar2 = 0;
LAB_0011a13a:
  return (uint8)uVar2;
}

Assistant:

static uint8 get8(vorb *z)
{
   if (USE_MEMORY(z)) {
      if (z->stream >= z->stream_end) { z->eof = TRUE; return 0; }
      return *z->stream++;
   }

   #ifndef STB_VORBIS_NO_STDIO
   {
   int c = fgetc(z->f);
   if (c == EOF) { z->eof = TRUE; return 0; }
   return c;
   }
   #endif
}